

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebug __thiscall
QtPrivate::printAssociativeContainer<QHash<QWidget*,QList<QGesture*>>>
          (QtPrivate *this,QDebug debug,char *which,QHash<QWidget_*,_QList<QGesture_*>_> *c)

{
  char *pcVar1;
  QDebug this_00;
  ulong uVar2;
  storage_type *psVar3;
  storage_type *psVar4;
  QTextStream *pQVar5;
  ulong uVar6;
  Data *pDVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QDebugStateSaver saver;
  undefined1 local_78 [8];
  QDebug local_70;
  QDebug local_68;
  QTextStream *local_60;
  QWidgetData *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar5 = *(QTextStream **)debug.stream;
  pQVar5[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar4 = (storage_type *)0x0;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      psVar4 = psVar3 + 1;
      pcVar1 = which + 1 + (long)psVar3;
      psVar3 = psVar4;
    } while (*pcVar1 != '\0');
  }
  QVar8.m_data = psVar4;
  QVar8.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<(pQVar5,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar5 = *(QTextStream **)debug.stream;
  if (pQVar5[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar5,' ');
    pQVar5 = *(QTextStream **)debug.stream;
  }
  QVar9.m_data = (storage_type *)0x1;
  QVar9.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar5,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pDVar7 = c->d;
  if (pDVar7 == (Data *)0x0) {
    pDVar7 = (Data *)0x0;
    uVar6 = 0;
LAB_002e4f79:
    if (uVar6 == 0 && pDVar7 == (Data *)0x0) goto LAB_002e514b;
  }
  else {
    if (pDVar7->spans->offsets[0] == 0xff) {
      uVar2 = 1;
      do {
        uVar6 = uVar2;
        if (pDVar7->numBuckets == uVar6) {
          pDVar7 = (Data *)0x0;
          uVar6 = 0;
          break;
        }
        uVar2 = uVar6 + 1;
      } while (pDVar7->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
      goto LAB_002e4f79;
    }
    uVar6 = 0;
  }
  do {
    QTextStream::operator<<(*(QTextStream **)debug.stream,'(');
    pQVar5 = *(QTextStream **)debug.stream;
    if (pQVar5[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar5,' ');
      pQVar5 = *(QTextStream **)debug.stream;
    }
    *(int *)(pQVar5 + 0x28) = *(int *)(pQVar5 + 0x28) + 1;
    local_78 = (undefined1  [8])pQVar5;
    ::operator<<((Stream *)&local_70,(QWidget *)local_78);
    this_00.stream = local_70.stream;
    QVar10.m_data = (storage_type *)0x2;
    QVar10.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_70.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
    }
    *(int *)(local_70.stream + 0x28) = *(int *)(local_70.stream + 0x28) + 1;
    local_68.stream = (Stream *)0x0;
    local_50[0] = (QArrayData *)local_70.stream;
    printSequentialContainer<QList<QGesture*>>
              ((QtPrivate *)&local_60,(Stream *)local_50,"QList",
               (QList<QGesture_*> *)
               (pDVar7->spans[uVar6 >> 7].entries
                [pDVar7->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f]].storage.data + 8));
    QDebug::~QDebug((QDebug *)local_50);
    QTextStream::operator<<(local_60,')');
    if (local_60[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_60,' ');
    }
    QDebug::~QDebug((QDebug *)&local_60);
    QDebug::~QDebug(&local_68);
    QDebug::~QDebug(&local_70);
    QDebug::~QDebug((QDebug *)local_78);
    do {
      if (pDVar7->numBuckets - 1 == uVar6) {
        uVar6 = 0;
        pDVar7 = (Data *)0x0;
        break;
      }
      uVar6 = uVar6 + 1;
    } while (pDVar7->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
  } while (uVar6 != 0 || pDVar7 != (Data *)0x0);
LAB_002e514b:
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  pQVar5 = *(QTextStream **)debug.stream;
  if (pQVar5[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar5,' ');
    pQVar5 = *(QTextStream **)debug.stream;
  }
  *(undefined8 *)debug.stream = 0;
  *(QTextStream **)this = pQVar5;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}